

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int sort_comp(lua_State *L,int a,int b)

{
  int iVar1;
  TValue *l;
  TValue *r;
  
  iVar1 = lua_type(L,2);
  if (iVar1 == 0) {
    l = index2adr(L,a);
    r = index2adr(L,b);
    if (r != &luaO_nilobject_ && l != &luaO_nilobject_) {
      iVar1 = luaV_lessthan(L,l,r);
      return iVar1;
    }
    iVar1 = 0;
  }
  else {
    lua_pushvalue(L,2);
    lua_pushvalue(L,a + -1);
    lua_pushvalue(L,b + -2);
    lua_call(L,2,1);
    iVar1 = lua_toboolean(L,-1);
    L->top = L->top + -1;
  }
  return iVar1;
}

Assistant:

static int sort_comp(lua_State*L,int a,int b){
if(!lua_isnil(L,2)){
int res;
lua_pushvalue(L,2);
lua_pushvalue(L,a-1);
lua_pushvalue(L,b-2);
lua_call(L,2,1);
res=lua_toboolean(L,-1);
lua_pop(L,1);
return res;
}
else
return lua_lessthan(L,a,b);
}